

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void finish_ssa(gen_ctx_t gen_ctx)

{
  gen_ctx_t gen_ctx_local;
  
  VARR_bb_insn_tdestroy(&gen_ctx->ssa_ctx->arg_bb_insns);
  VARR_bb_insn_tdestroy(&gen_ctx->ssa_ctx->undef_insns);
  VARR_bb_insn_tdestroy(&gen_ctx->ssa_ctx->phis);
  VARR_bb_insn_tdestroy(&gen_ctx->ssa_ctx->deleted_phis);
  HTAB_def_tab_el_t_destroy(&gen_ctx->ssa_ctx->def_tab);
  VARR_ssa_edge_tdestroy(&gen_ctx->ssa_ctx->ssa_edges_to_process);
  VARR_size_tdestroy(&gen_ctx->ssa_ctx->curr_reg_indexes);
  VARR_chardestroy(&gen_ctx->ssa_ctx->reg_name);
  free(gen_ctx->ssa_ctx);
  gen_ctx->ssa_ctx = (ssa_ctx *)0x0;
  return;
}

Assistant:

static void finish_ssa (gen_ctx_t gen_ctx) {
  VARR_DESTROY (bb_insn_t, arg_bb_insns);
  VARR_DESTROY (bb_insn_t, undef_insns);
  VARR_DESTROY (bb_insn_t, phis);
  VARR_DESTROY (bb_insn_t, deleted_phis);
  HTAB_DESTROY (def_tab_el_t, def_tab);
  VARR_DESTROY (ssa_edge_t, ssa_edges_to_process);
  VARR_DESTROY (size_t, curr_reg_indexes);
  VARR_DESTROY (char, reg_name);
  free (gen_ctx->ssa_ctx);
  gen_ctx->ssa_ctx = NULL;
}